

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

bool fs_setenv(string_view name,string_view value)

{
  int iVar1;
  string_view fname;
  
  iVar1 = setenv(name._M_str,value._M_str,1);
  if (iVar1 != 0) {
    fname._M_str = "fs_setenv";
    fname._M_len = 9;
    fs_print_error(name,fname);
  }
  return iVar1 == 0;
}

Assistant:

bool fs_setenv(std::string_view name, std::string_view value)
{

#if defined(_WIN32)
  // SetEnvironmentVariable returned OK but set blank values
  // https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/putenv-wputenv

  if(_putenv_s(name.data(), value.data()) == 0)  FFS_LIKELY
    return true;
#else
  // https://www.man7.org/linux/man-pages/man3/setenv.3.html
  if(setenv(name.data(), value.data(), 1) == 0)  FFS_LIKELY
    return true;
#endif

  fs_print_error(name, __func__);
  return false;
}